

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void SetAdditionalBindInfoForVariables(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  Symbol *this;
  bool bVar1;
  BOOL BVar2;
  ParseNodeVar *pPVar3;
  FuncInfo *this_00;
  Scope *pSVar4;
  Scope *pSVar5;
  FuncInfo *func;
  Symbol *sym;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode_local;
  
  pPVar3 = ParseNode::AsParseNodeVar(pnode);
  this = pPVar3->sym;
  if (this == (Symbol *)0x0) {
    return;
  }
  this_00 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  bVar1 = Symbol::GetIsGlobal(this);
  if ((!bVar1) && (bVar1 = Symbol::IsArguments(this), !bVar1)) {
    pSVar4 = Symbol::GetScope(this);
    pSVar5 = FuncInfo::GetBodyScope(this_00);
    if (pSVar4 != pSVar5) {
      pSVar4 = Symbol::GetScope(this);
      pSVar5 = FuncInfo::GetParamScope(this_00);
      if (pSVar4 != pSVar5) {
        pSVar4 = Symbol::GetScope(this);
        bVar1 = Scope::GetCanMerge(pSVar4);
        if (!bVar1) goto LAB_00b78d51;
      }
    }
    bVar1 = FuncInfo::GetChildCallsEval(this_00);
    if (bVar1) {
      FuncInfo::SetHasLocalInClosure(this_00,true);
    }
    else {
      Symbol::RecordDef(this);
    }
  }
LAB_00b78d51:
  bVar1 = Symbol::IsUsedInLdElem(this);
  if (bVar1) {
    pPVar3 = ParseNode::AsParseNodeVar(pnode);
    Ident::TrySetIsUsedInLdElem(pPVar3->pnodeInit);
  }
  BVar2 = ByteCodeGenerator::IsInLoop(byteCodeGenerator);
  if ((BVar2 != 0) &&
     (pPVar3 = ParseNode::AsParseNodeVar(pnode), pPVar3->pnodeInit != (ParseNodePtr)0x0)) {
    Symbol::SetIsUsed(this,true);
  }
  return;
}

Assistant:

void SetAdditionalBindInfoForVariables(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    Symbol *sym = pnode->AsParseNodeVar()->sym;
    if (sym == nullptr)
    {
        return;
    }

    FuncInfo* func = byteCodeGenerator->TopFuncInfo();
    if (!sym->GetIsGlobal() && !sym->IsArguments() &&
        (sym->GetScope() == func->GetBodyScope() || sym->GetScope() == func->GetParamScope() || sym->GetScope()->GetCanMerge()))
    {
        if (func->GetChildCallsEval())
        {
            func->SetHasLocalInClosure(true);
        }
        else
        {
            sym->RecordDef();
        }
    }
    if (sym->IsUsedInLdElem())
    {
        Ident::TrySetIsUsedInLdElem(pnode->AsParseNodeVar()->pnodeInit);
    }

    // If this decl does an assignment inside a loop body, then there's a chance
    // that a jitted loop body will expect us to begin with a valid value in this var.
    // So mark the sym as used so that we guarantee the var will at least get "undefined".
    if (byteCodeGenerator->IsInLoop() &&
        pnode->AsParseNodeVar()->pnodeInit)
    {
        sym->SetIsUsed(true);
    }
}